

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_get.c
# Opt level: O3

int buffer_get(buffer *s,char *buf,uint len)

{
  _func_int_varargs *p_Var1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  
  uVar2 = s->p;
  if (uVar2 == 0) {
    if (s->n <= len) {
      p_Var1 = s->op;
      uVar2 = s->fd;
      do {
        iVar3 = (*p_Var1)((ulong)uVar2,buf,(ulong)len);
        if (iVar3 != -1) {
          return iVar3;
        }
        piVar4 = __errno_location();
      } while (*piVar4 == error_intr);
      return -1;
    }
    iVar3 = buffer_feed(s);
    if (iVar3 < 1) {
      return iVar3;
    }
    uVar2 = s->p;
  }
  if (uVar2 < len) {
    len = uVar2;
  }
  s->p = uVar2 - len;
  byte_copy(buf,len,s->x + s->n);
  s->n = s->n + len;
  return len;
}

Assistant:

int buffer_get(buffer *s,char *buf,unsigned int len)
{
  int r;
 
  if (s->p > 0) return getthis(s,buf,len);
  if (s->n <= len) return oneread(s->op,s->fd,buf,len);
  r = buffer_feed(s); if (r <= 0) return r;
  return getthis(s,buf,len);
}